

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O0

void ComputeResidualsForTile
               (int width,int height,int tile_x,int tile_y,int min_bits,uint32_t update_up_to_index,
               uint32_t *all_argb,uint32_t *argb_scratch,uint32_t *argb,int max_quantization,
               int exact,int used_subtract_green)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint32_t *histo_argb_00;
  uint32_t *histo_argb_01;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  byte in_R8B;
  uint in_R9D;
  uint32_t *in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  int in_stack_00000020;
  undefined4 in_stack_00000028;
  int in_stack_00000030;
  uint32_t *super_histo;
  uint32_t subsampling_index;
  uint32_t *tmp;
  int relative_x;
  int y;
  uint32_t *histo_argb;
  int relative_y;
  uint32_t residuals [512];
  int mode;
  uint8_t *max_diffs;
  uint32_t *current_row;
  uint32_t *upper_row;
  int context_width;
  int context_start_x;
  int have_left;
  int max_x;
  int max_y;
  int tile_size;
  int start_y;
  int start_x;
  int in_stack_fffffffffffff72c;
  int in_stack_fffffffffffff730;
  int in_stack_fffffffffffff734;
  undefined4 in_stack_fffffffffffff738;
  undefined4 in_stack_fffffffffffff73c;
  int in_stack_fffffffffffff740;
  int in_stack_fffffffffffff744;
  int in_stack_fffffffffffff750;
  int in_stack_fffffffffffff754;
  int in_stack_fffffffffffff760;
  uint local_89c;
  int x_end;
  int in_stack_fffffffffffff770;
  int in_stack_fffffffffffff780;
  int local_87c;
  uint32_t in_stack_fffffffffffff788;
  uint32_t *in_stack_fffffffffffff790;
  int local_74;
  long local_68;
  long local_60;
  long lVar7;
  
  iVar1 = in_EDX << (in_R8B & 0x1f);
  iVar2 = in_ECX << (in_R8B & 0x1f);
  iVar3 = 1 << (in_R8B & 0x1f);
  iVar4 = GetMin(iVar3,in_ESI - iVar2);
  iVar3 = GetMin(iVar3,in_EDI - iVar1);
  uVar5 = (uint)(0 < iVar1);
  iVar1 = iVar1 - uVar5;
  local_60 = in_stack_00000010;
  local_68 = in_stack_00000010 + (long)in_EDI * 4 + 4;
  for (local_74 = 0; local_74 < 0xe; local_74 = local_74 + 1) {
    histo_argb_00 = GetHistoArgb(in_stack_00000008,0,local_74);
    if (0 < iVar2) {
      memcpy((void *)(local_68 + (long)iVar1 * 4),
             (void *)(in_stack_00000018 + (long)((iVar2 + -1) * in_EDI) * 4 + (long)iVar1 * 4),
             (long)(int)(iVar3 + uVar5 + 1) << 2);
    }
    for (local_87c = 0; lVar7 = local_60, local_87c < iVar4; local_87c = local_87c + 1) {
      iVar6 = iVar2 + local_87c;
      local_60 = local_68;
      local_68 = lVar7;
      memcpy((void *)(lVar7 + (long)iVar1 * 4),
             (void *)(in_stack_00000018 + (long)(iVar6 * in_EDI) * 4 + (long)iVar1 * 4),
             (long)(int)(iVar3 + uVar5 + (uint)(iVar6 + 1 < in_ESI)) << 2);
      x_end = (int)lVar7;
      if (((1 < in_stack_00000020) && (0 < iVar6)) && (iVar6 + 1 < in_ESI)) {
        MaxDiffsForRow(in_stack_fffffffffffff744,in_stack_fffffffffffff740,
                       (uint32_t *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738),
                       (uint8_t *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                       in_stack_fffffffffffff72c);
      }
      in_stack_fffffffffffff730 = in_stack_00000020;
      in_stack_fffffffffffff738 = in_stack_00000028;
      in_stack_fffffffffffff740 = in_stack_00000030;
      GetResidual(in_stack_fffffffffffff754,in_stack_fffffffffffff750,
                  (uint32_t *)&stack0xfffffffffffff788,
                  (uint32_t *)CONCAT44(in_stack_fffffffffffff744,in_stack_00000030),
                  (uint8_t *)CONCAT44(in_stack_fffffffffffff73c,in_stack_00000028),
                  in_stack_fffffffffffff734,in_stack_fffffffffffff760,x_end,
                  in_stack_fffffffffffff770,(int)histo_argb_00,in_stack_fffffffffffff780,
                  in_stack_fffffffffffff788,in_stack_fffffffffffff790);
      for (in_stack_fffffffffffff770 = 0; in_stack_fffffffffffff770 < iVar3;
          in_stack_fffffffffffff770 = in_stack_fffffffffffff770 + 1) {
        UpdateHisto(histo_argb_00,
                    *(uint32_t *)(&stack0xfffffffffffff788 + (long)in_stack_fffffffffffff770 * 4));
      }
      if (in_R9D != 0) {
        for (local_89c = 1; local_89c <= in_R9D; local_89c = local_89c + 1) {
          histo_argb_01 = GetHistoArgb(in_stack_00000008,local_89c,local_74);
          for (in_stack_fffffffffffff770 = 0; in_stack_fffffffffffff770 < iVar3;
              in_stack_fffffffffffff770 = in_stack_fffffffffffff770 + 1) {
            UpdateHisto(histo_argb_01,
                        *(uint32_t *)
                         (&stack0xfffffffffffff788 + (long)in_stack_fffffffffffff770 * 4));
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void ComputeResidualsForTile(
    int width, int height, int tile_x, int tile_y, int min_bits,
    uint32_t update_up_to_index, uint32_t* const all_argb,
    uint32_t* const argb_scratch, const uint32_t* const argb,
    int max_quantization, int exact, int used_subtract_green) {
  const int start_x = tile_x << min_bits;
  const int start_y = tile_y << min_bits;
  const int tile_size = 1 << min_bits;
  const int max_y = GetMin(tile_size, height - start_y);
  const int max_x = GetMin(tile_size, width - start_x);
  // Whether there exist columns just outside the tile.
  const int have_left = (start_x > 0);
  // Position and size of the strip covering the tile and adjacent columns if
  // they exist.
  const int context_start_x = start_x - have_left;
#if (WEBP_NEAR_LOSSLESS == 1)
  const int context_width = max_x + have_left + (max_x < width - start_x);
#endif
  // The width of upper_row and current_row is one pixel larger than image width
  // to allow the top right pixel to point to the leftmost pixel of the next row
  // when at the right edge.
  uint32_t* upper_row = argb_scratch;
  uint32_t* current_row = upper_row + width + 1;
  uint8_t* const max_diffs = (uint8_t*)(current_row + width + 1);
  int mode;
  // Need pointers to be able to swap arrays.
  uint32_t residuals[1 << MAX_TRANSFORM_BITS];
  assert(max_x <= (1 << MAX_TRANSFORM_BITS));
  for (mode = 0; mode < kNumPredModes; ++mode) {
    int relative_y;
    uint32_t* const histo_argb =
        GetHistoArgb(all_argb, /*subsampling_index=*/0, mode);
    if (start_y > 0) {
      // Read the row above the tile which will become the first upper_row.
      // Include a pixel to the left if it exists; include a pixel to the right
      // in all cases (wrapping to the leftmost pixel of the next row if it does
      // not exist).
      memcpy(current_row + context_start_x,
             argb + (start_y - 1) * width + context_start_x,
             sizeof(*argb) * (max_x + have_left + 1));
    }
    for (relative_y = 0; relative_y < max_y; ++relative_y) {
      const int y = start_y + relative_y;
      int relative_x;
      uint32_t* tmp = upper_row;
      upper_row = current_row;
      current_row = tmp;
      // Read current_row. Include a pixel to the left if it exists; include a
      // pixel to the right in all cases except at the bottom right corner of
      // the image (wrapping to the leftmost pixel of the next row if it does
      // not exist in the current row).
      memcpy(current_row + context_start_x,
             argb + y * width + context_start_x,
             sizeof(*argb) * (max_x + have_left + (y + 1 < height)));
#if (WEBP_NEAR_LOSSLESS == 1)
      if (max_quantization > 1 && y >= 1 && y + 1 < height) {
        MaxDiffsForRow(context_width, width, argb + y * width + context_start_x,
                       max_diffs + context_start_x, used_subtract_green);
      }
#endif

      GetResidual(width, height, upper_row, current_row, max_diffs, mode,
                  start_x, start_x + max_x, y, max_quantization, exact,
                  used_subtract_green, residuals);
      for (relative_x = 0; relative_x < max_x; ++relative_x) {
        UpdateHisto(histo_argb, residuals[relative_x]);
      }
      if (update_up_to_index > 0) {
        uint32_t subsampling_index;
        for (subsampling_index = 1; subsampling_index <= update_up_to_index;
             ++subsampling_index) {
          uint32_t* const super_histo =
              GetHistoArgb(all_argb, subsampling_index, mode);
          for (relative_x = 0; relative_x < max_x; ++relative_x) {
            UpdateHisto(super_histo, residuals[relative_x]);
          }
        }
      }
    }
  }
}